

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CategoricalMapping.pb.h
# Opt level: O2

Int64ToStringMap * __thiscall
CoreML::Specification::CategoricalMapping::mutable_int64tostringmap(CategoricalMapping *this)

{
  Int64ToStringMap *this_00;
  
  if (this->_oneof_case_[0] == 2) {
    this_00 = (Int64ToStringMap *)(this->MappingType_).stringtoint64map_;
  }
  else {
    clear_MappingType(this);
    this->_oneof_case_[0] = 2;
    this_00 = (Int64ToStringMap *)operator_new(0x38);
    Int64ToStringMap::Int64ToStringMap(this_00);
    (this->MappingType_).int64tostringmap_ = this_00;
  }
  return this_00;
}

Assistant:

inline ::CoreML::Specification::Int64ToStringMap* CategoricalMapping::mutable_int64tostringmap() {
  if (!has_int64tostringmap()) {
    clear_MappingType();
    set_has_int64tostringmap();
    MappingType_.int64tostringmap_ = new ::CoreML::Specification::Int64ToStringMap;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.CategoricalMapping.int64ToStringMap)
  return MappingType_.int64tostringmap_;
}